

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.hpp
# Opt level: O3

int schema::Schema::countColumns<unsigned_long,std::__cxx11::string,std::__cxx11::string>
              (Column<unsigned_long> *others,
              Column<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *others_1,
              Column<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *others_2)

{
  int pos;
  int local_2c;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._M_unused._M_object = &local_2c;
  local_2c = 0;
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<void_(const_schema::ColumnBase_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/dkolmakov[P]hm/src/././schema.hpp:107:9)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(const_schema::ColumnBase_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/dkolmakov[P]hm/src/././schema.hpp:107:9)>
             ::_M_manager;
  doForAll<unsigned_long,std::__cxx11::string,std::__cxx11::string>
            ((function<void_(const_schema::ColumnBase_&)> *)&local_28,others,others_1,others_2);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return local_2c;
}

Assistant:

static int countColumns(const Column<Others>&... others) {
    int pos = 0;

    doForAll(
        [&pos](const ColumnBase& value) {
          value.setPos(pos);
          ++pos;
        },
        others...);

    return pos;
  }